

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fstack.cpp
# Opt level: O0

void fstk_AddIncludePath(char *path)

{
  size_t __n;
  char *pcVar1;
  int *piVar2;
  char *pcVar3;
  ulong uVar4;
  char *local_30;
  char *end;
  char *str;
  size_t allocSize;
  size_t len;
  char *path_local;
  
  if (*path != '\0') {
    if (nbIncPaths < 0x80) {
      __n = strlen(path);
      pcVar1 = (char *)malloc(__n + (path[__n - 1] != '/') + 1);
      if (pcVar1 == (char *)0x0) {
        piVar2 = __errno_location();
        pcVar1 = strerror(*piVar2);
        error("Failed to allocate new include path: %s\n",pcVar1);
      }
      else {
        memcpy(pcVar1,path,__n);
        pcVar3 = pcVar1 + __n;
        local_30 = pcVar3;
        if (pcVar3[-1] != '/') {
          local_30 = pcVar3 + 1;
          *pcVar3 = '/';
        }
        *local_30 = '\0';
        uVar4 = (ulong)nbIncPaths;
        nbIncPaths = nbIncPaths + 1;
        includePaths[uVar4] = pcVar1;
      }
    }
    else {
      error("Too many include directories passed from command line\n");
    }
  }
  return;
}

Assistant:

void fstk_AddIncludePath(char const *path)
{
	if (path[0] == '\0')
		return;
	if (nbIncPaths >= MAXINCPATHS) {
		error("Too many include directories passed from command line\n");
		return;
	}
	size_t len = strlen(path);
	size_t allocSize = len + (path[len - 1] != '/') + 1;
	char *str = (char *)malloc(allocSize);

	if (!str) {
		// Attempt to continue without that path
		error("Failed to allocate new include path: %s\n", strerror(errno));
		return;
	}
	memcpy(str, path, len);
	char *end = str + len - 1;

	if (*end++ != '/')
		*end++ = '/';
	*end = '\0';
	includePaths[nbIncPaths++] = str;
}